

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TripWireTests.cpp
# Opt level: O1

TriplineType __thiscall gmlc::concurrency::TripWire::getIndexedLine(TripWire *this,uint index)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer psVar2;
  int iVar3;
  undefined8 uVar4;
  TriplineType TVar5;
  
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)index;
  if (getIndexedLine(unsigned_int)::triplines == '\0') {
    iVar3 = __cxa_guard_acquire(&getIndexedLine(unsigned_int)::triplines);
    if (iVar3 != 0) {
      make_triplines(&getIndexedLine::triplines,10);
      __cxa_atexit(std::
                   vector<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
                   ::~vector,&getIndexedLine::triplines,&__dso_handle);
      __cxa_guard_release(&getIndexedLine(unsigned_int)::triplines);
    }
  }
  psVar2 = getIndexedLine::triplines.
           super__Vector_base<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  TVar5.super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       ((long)getIndexedLine::triplines.
              super__Vector_base<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)getIndexedLine::triplines.
              super__Vector_base<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 4);
  if (p_Var1 < TVar5.super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi) {
    *(element_type **)this =
         getIndexedLine::triplines.
         super__Vector_base<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[(long)p_Var1].
         super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var1 = psVar2[(long)p_Var1].super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var1;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
    TVar5.super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (TriplineType)TVar5.super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>;
  }
  uVar4 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  __cxa_guard_abort(&getIndexedLine(unsigned_int)::triplines);
  _Unwind_Resume(uVar4);
}

Assistant:

TEST(tripwire, indexed)
{
    TripWireDetector detect(5);

    EXPECT_FALSE(detect.isTripped());

    EXPECT_THROW(TripWireDetector(12), std::out_of_range);
    // smaller scope for trigger
    {
        TripWireTrigger trig(5);
        EXPECT_FALSE(detect.isTripped());
    }
    EXPECT_TRUE(detect.isTripped());
}